

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerCheckLowerIntBound(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  LabelInstr *target;
  Opnd *pOVar4;
  undefined4 *puVar5;
  Opnd *compareSrc2;
  Instr *instr_00;
  Instr *helperCallInstr;
  LabelInstr *continueLabel;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  target = IR::LabelInstr::New(Label,instr->m_func,false);
  pOVar4 = IR::Instr::GetSrc1(instr);
  bVar3 = IR::Opnd::IsInt32(pOVar4);
  if (!bVar3) {
    pOVar4 = IR::Instr::GetSrc1(instr);
    bVar3 = IR::Opnd::IsUInt32(pOVar4);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x71cf,"(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32())",
                         "instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  pOVar4 = IR::Instr::GetSrc1(instr);
  compareSrc2 = IR::Instr::GetSrc2(instr);
  InsertCompareBranch(this,pOVar4,compareSrc2,BrGe_A,target,instr,false);
  instr_00 = IR::Instr::New(CALL,instr->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr_00,HelperIntRangeCheckFailure,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerCheckLowerIntBound(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, false /*isOpHelper*/);

    Assert(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32());
    InsertCompareBranch(instr->GetSrc1(), instr->GetSrc2(), Js::OpCode::BrGe_A, continueLabel, instr);

    IR::Instr* helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    instr->InsertBefore(helperCallInstr);
    m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::HelperIntRangeCheckFailure);

    instr->InsertAfter(continueLabel);

    instr->Remove();

    return instrPrev;
}